

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture3DLodControlTestInstance *this)

{
  int blue;
  int iVar1;
  deUint32 width;
  deUint32 height;
  int iVar2;
  int iVar3;
  TestTexture3D *pTVar4;
  undefined4 extraout_var;
  TextureBinding *this_00;
  reference pvVar5;
  int *piVar6;
  undefined4 extraout_var_00;
  TestContext *pTVar7;
  qpWatchDog *watchDog;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  deUint32 dVar10;
  Texture3DView TVar11;
  int local_9cc;
  int local_9c8;
  bool local_9c1;
  int local_988;
  int local_984;
  allocator<char> local_949;
  string local_948;
  byte local_923;
  byte local_922;
  allocator<char> local_921;
  string local_920;
  undefined1 local_8fa;
  allocator<char> local_8f9;
  undefined1 local_8f8 [6];
  bool isOk;
  allocator<char> local_8d1;
  string local_8d0;
  LogImage local_8b0;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  LogImage local_7d0;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  LogImage local_6f0;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  LogImageSet local_610;
  MessageBuilder local_5d0;
  Texture3DView local_450;
  PixelBufferAccess local_440;
  PixelBufferAccess local_418;
  PixelBufferAccess local_3f0;
  ConstPixelBufferAccess local_3c8;
  PixelBufferAccess local_3a0;
  ConstPixelBufferAccess local_378;
  Texture3DView local_350;
  SurfaceAccess local_340;
  uint local_320;
  int local_31c;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_2f0;
  Vector<int,_4> local_2e0;
  IVec4 local_2d0;
  tcu local_2c0 [8];
  float afStack_2b8 [2];
  Vector<int,_3> local_2b0;
  Vector<int,_3> local_2a4;
  int local_298;
  undefined1 local_294 [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat pixelFormat;
  undefined1 local_20c [8];
  IVec4 formatBitDepth;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_1d8;
  int local_19c;
  int local_198;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  undefined1 local_180 [8];
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams refParams;
  Sampler sampler;
  int viewportHeight;
  int viewportWidth;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  Texture3D *refTexture;
  FilterMode magFilter;
  WrapMode wrapR;
  WrapMode wrapT;
  WrapMode wrapS;
  Texture3DLodControlTestInstance *this_local;
  
  pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture3D>::operator->(&this->m_texture);
  iVar1 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x11])();
  fmtInfo.lookupBias.m_data._8_8_ =
       tcu::TextureLevelPyramid::getFormat((TextureLevelPyramid *)CONCAT44(extraout_var,iVar1));
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&viewportHeight,(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  height = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  util::createSampler((Sampler *)&refParams.baseLevel,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,
                      NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TEXTURETYPE_3D,
             (Sampler *)&refParams.baseLevel,LODMODE_EXACT);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_180,width,height);
  cellWidth = 4;
  cellHeight = 4;
  dVar10 = width;
  if ((int)width < 0) {
    dVar10 = width + 3;
  }
  local_198 = (int)dVar10 >> 2;
  dVar10 = height;
  if ((int)height < 0) {
    dVar10 = height + 3;
  }
  local_19c = (int)dVar10 >> 2;
  util::createSampler(&local_1d8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_Texture3DTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                      minFilter,NEAREST);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_1d8)
  ;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ =
       glu::TextureTestUtil::getSamplerType(*(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  iVar2 = de::max<int>(this->m_texWidth,this->m_texHeight);
  iVar2 = de::max<int>(iVar2,this->m_texDepth);
  refParams.maxLod = (float)deLog2Floor32(iVar2);
  for (curX = 0; curX < 4; curX = curX + 1) {
    for (curY = 0; curY < 4; curY = curY + 1) {
      iVar2 = local_198 * curY;
      iVar3 = local_19c * curX;
      if (curY == 3) {
        local_984 = width - iVar2;
      }
      else {
        local_984 = local_198;
      }
      if (curX == 3) {
        local_988 = height - iVar3;
      }
      else {
        local_988 = local_19c;
      }
      formatBitDepth.m_data[3] = local_988;
      formatBitDepth.m_data[2] = curY + curX * 4;
      getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                         formatBitDepth.m_data[2]);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                 (ulong)(uint)formatBitDepth.m_data[2]);
      util::TextureRenderer::setViewport
                (&this->m_renderer,(float)iVar2,(float)iVar3,(float)local_984,
                 (float)formatBitDepth.m_data[3]);
      this_00 = util::TextureRenderer::getTextureBinding(&this->m_renderer,0);
      util::TextureBinding::updateTextureViewMipLevels
                (this_00,(deUint32)refParams.minLod,(deUint32)refParams.maxLod);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      util::TextureRenderer::renderQuad
                (&this->m_renderer,(Surface *)local_180,0,pvVar5,
                 (ReferenceParams *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)local_20c,(TextureFormat *)&pixelFormat.blueBits);
  piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_20c,0);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_20c,1);
  iVar3 = *piVar6;
  piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_20c,2);
  blue = *piVar6;
  piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_20c,3);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4),iVar2,iVar3,blue,*piVar6);
  local_9c1 = true;
  if (this->m_minFilter != NEAREST_MIPMAP_LINEAR) {
    local_9c1 = this->m_minFilter == LINEAR_MIPMAP_LINEAR;
  }
  referenceFrame.m_pixels.m_cap._3_1_ = local_9c1;
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,width,height);
  tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,width,height);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_294,RULE_VULKAN);
  local_298 = 0;
  tcu::Vector<int,_3>::Vector(&local_2a4,0x14,0x14,0x14);
  lookupPrec.coordBits.m_data[0] = local_2a4.m_data[2];
  lodPrec.derivateBits = local_2a4.m_data[0];
  lodPrec.lodBits = local_2a4.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_2b0,0x10,0x10,0x10);
  lookupPrec.uvwBits.m_data[0] = local_2b0.m_data[2];
  lookupPrec.coordBits.m_data[1] = local_2b0.m_data[0];
  lookupPrec.coordBits.m_data[2] = local_2b0.m_data[1];
  glu::TextureTestUtil::getBitsVec
            ((TextureTestUtil *)&local_2f0,(PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4)
            );
  tcu::operator-((tcu *)&local_2e0,&local_2f0,(referenceFrame.m_pixels.m_cap._3_1_ & 1) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
  tcu::max<int,4>((tcu *)&local_2d0,&local_2e0,(Vector<int,_4> *)&gridY_1);
  tcu::computeFixedPointThreshold(local_2c0,&local_2d0);
  lookupPrec.uvwBits.m_data._4_8_ = local_2c0;
  lookupPrec.colorThreshold.m_data[0] = afStack_2b8[0];
  lookupPrec.colorThreshold.m_data[1] = afStack_2b8[1];
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)&gridX_1,(PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4));
  lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
  numFailedPixels = 10;
  lodPrec.rule = 8;
  for (curX_1 = 0; curX_1 < 4; curX_1 = curX_1 + 1) {
    for (curY_1 = 0; curY_1 < 4; curY_1 = curY_1 + 1) {
      curW_1 = local_198 * curY_1;
      curH_1 = local_19c * curX_1;
      if (curY_1 == 3) {
        local_9c8 = width - curW_1;
      }
      else {
        local_9c8 = local_198;
      }
      cellNdx_1 = local_9c8;
      if (curX_1 == 3) {
        local_9cc = height - curH_1;
      }
      else {
        local_9cc = local_19c;
      }
      local_31c = local_9cc;
      local_320 = curY_1 + curX_1 * 4;
      getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                         local_320);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(ulong)local_320);
      tcu::SurfaceAccess::SurfaceAccess
                (&local_340,(Surface *)&errorMask.m_pixels.m_cap,
                 (PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4),curW_1,curH_1,cellNdx_1,
                 local_31c);
      TVar11 = tcu::Texture3D::operator_cast_to_Texture3DView
                         ((Texture3D *)CONCAT44(extraout_var,iVar1));
      local_350.m_levels = TVar11.m_levels;
      local_350.m_numLevels = TVar11.m_numLevels;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      glu::TextureTestUtil::sampleTexture
                (&local_340,&local_350,pvVar5,
                 (ReferenceParams *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      tcu::Surface::getAccess(&local_3a0,(Surface *)local_180);
      tcu::getSubregion((PixelBufferAccess *)&local_378,&local_3a0,curW_1,curH_1,cellNdx_1,local_31c
                       );
      tcu::Surface::getAccess(&local_3f0,(Surface *)&errorMask.m_pixels.m_cap);
      tcu::getSubregion((PixelBufferAccess *)&local_3c8,&local_3f0,curW_1,curH_1,cellNdx_1,local_31c
                       );
      tcu::Surface::getAccess(&local_440,(Surface *)&lookupPrec.colorMask);
      tcu::getSubregion(&local_418,&local_440,curW_1,curH_1,cellNdx_1,local_31c);
      pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture3D>::operator->(&this->m_texture);
      iVar2 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x11])();
      TVar11 = tcu::Texture3D::operator_cast_to_Texture3DView
                         ((Texture3D *)CONCAT44(extraout_var_00,iVar2));
      local_450.m_levels = TVar11.m_levels;
      local_450.m_numLevels = TVar11.m_numLevels;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
      watchDog = tcu::TestContext::getWatchDog(pTVar7);
      iVar2 = glu::TextureTestUtil::computeTextureLookupDiff
                        (&local_378,&local_3c8,&local_418,&local_450,pvVar5,
                         (ReferenceParams *)
                         &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_294,watchDog
                        );
      local_298 = iVar2 + local_298;
    }
  }
  if (0 < local_298) {
    pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_5d0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_5d0,(char (*) [41])"ERROR: Image verification failed, found ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_298);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5d0);
  }
  pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar8 = tcu::TestContext::getLog(pTVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Result",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"Verification result",&local_659);
  tcu::LogImageSet::LogImageSet(&local_610,&local_630,&local_658);
  pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"Rendered",&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Rendered image",&local_739);
  tcu::LogImage::LogImage
            (&local_6f0,&local_710,&local_738,(Surface *)local_180,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar8,&local_6f0);
  tcu::LogImage::~LogImage(&local_6f0);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  tcu::LogImageSet::~LogImageSet(&local_610);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  if (0 < local_298) {
    pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Reference",&local_7f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_818,"Ideal reference",&local_819);
    tcu::LogImage::LogImage
              (&local_7d0,&local_7f0,&local_818,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_7d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"ErrorMask",&local_8d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_8f8,"Error mask",&local_8f9);
    tcu::LogImage::LogImage
              (&local_8b0,&local_8d0,(string *)local_8f8,(Surface *)&lookupPrec.colorMask,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar8,&local_8b0);
    tcu::LogImage::~LogImage(&local_8b0);
    std::__cxx11::string::~string((string *)local_8f8);
    std::allocator<char>::~allocator(&local_8f9);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    tcu::LogImage::~LogImage(&local_7d0);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
  }
  pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar8 = tcu::TestContext::getLog(pTVar7);
  tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  local_8fa = local_298 == 0;
  local_922 = 0;
  local_923 = 0;
  if ((bool)local_8fa) {
    std::allocator<char>::allocator();
    local_922 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"pass",&local_921);
    local_923 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_920);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"fail",&local_949);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  if ((local_923 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_920);
  }
  if ((local_922 & 1) != 0) {
    std::allocator<char>::~allocator(&local_921);
  }
  tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)local_180);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture3DLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapR			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::Texture3D&			refTexture		= m_texture->getTexture();
	const tcu::TextureFormat&		texFmt			= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_3D, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int						gridWidth		= 4;
	const int						gridHeight		= 4;
	const int						cellWidth		= viewportWidth / gridWidth;
	const int						cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(wrapS, wrapT, wrapR, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;
	refParams.maxLevel		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth));

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			getReferenceParams(refParams,cellNdx);
			//Render
			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(refParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}